

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcheckbox.cpp
# Opt level: O2

void QCheckBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      checkStateChanged((QCheckBox *)_o,*_a[1]);
      return;
    }
    if (_id == 0) {
      stateChanged((QCheckBox *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      *(byte *)(*(long *)(_o + 8) + 0x2b4) = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 0xfe | **_a;
    }
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::indexOfMethod<void(QCheckBox::*)(int)>
                      ((QtMocHelpers *)_a,(void **)stateChanged,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QCheckBox::*)(Qt::CheckState)>
                ((QtMocHelpers *)_a,(void **)checkStateChanged,0,1);
      return;
    }
  }
  return;
}

Assistant:

void QCheckBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCheckBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->checkStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::CheckState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(int )>(_a, &QCheckBox::stateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(Qt::CheckState )>(_a, &QCheckBox::checkStateChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTristate(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTristate(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}